

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::SatdLpTest_Random_Test::TestBody(SatdLpTest_Random_Test *this)

{
  Message *pMVar1;
  AssertHelper *this_00;
  char *in_RDI;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  int expected;
  char (*in_stack_ffffffffffffff98) [24];
  SatdTestBase<short,_int_(*)(const_short_*,_int)> *in_stack_ffffffffffffffa0;
  char *message;
  int line;
  Type type;
  AssertHelper *in_stack_ffffffffffffffd0;
  char local_18 [12];
  undefined4 local_c;
  
  type = *(Type *)(in_RDI + 0x18);
  if (type == 0x10) {
    local_c = 0x321f2;
  }
  else if (type == 0x40) {
    local_c = 0x10ff5e;
  }
  else if (type == 0x100) {
    local_c = 0x41217f;
  }
  else {
    if (type != 0x400) {
      message = local_18;
      testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
      pMVar1 = testing::Message::operator<<
                         ((Message *)in_stack_ffffffffffffffa0,
                          (char (*) [20])in_stack_ffffffffffffff98);
      line = (int)((ulong)pMVar1 >> 0x20);
      testing::Message::operator<<
                ((Message *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
      this_00 = (AssertHelper *)
                testing::Message::operator<<
                          ((Message *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffffd0,type,in_RDI,line,message);
      testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0xa5204c);
      return;
    }
    local_c = 0x102b2e2;
  }
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom(in_stack_ffffffffffffffa0);
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::Check
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this,expected);
  return;
}

Assistant:

TEST_P(SatdLpTest, Random) {
  int expected;
  switch (satd_size_) {
    case 16: expected = 205298; break;
    case 64: expected = 1113950; break;
    case 256: expected = 4268415; break;
    case 1024: expected = 16954082; break;
    default:
      FAIL() << "Invalid satd size (" << satd_size_
             << ") valid: 16/64/256/1024";
  }
  FillRandom();
  Check(expected);
}